

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compareB44.cpp
# Opt level: O2

bool withinB44ErrorBounds(half (*A) [4],half (*B) [4])

{
  int iVar1;
  bool bVar2;
  short sVar3;
  short sVar4;
  int i_1;
  int iVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  byte bVar9;
  ushort uVar10;
  ushort uVar11;
  int i;
  uint uVar12;
  int iVar13;
  long lVar14;
  int i_3;
  int iVar15;
  half (*pahVar16) [4];
  int shift;
  ulong uVar17;
  half (*pahVar18) [4];
  int j;
  long lVar19;
  bool bVar20;
  unsigned_short A1 [16];
  int d [16];
  int aiStack_b8 [18];
  half (*local_70) [4];
  ulong local_68;
  ulong local_60;
  ushort auStack_58 [20];
  
  bVar2 = true;
  pahVar16 = A;
  pahVar18 = B;
  for (lVar14 = 0; lVar14 != 4; lVar14 = lVar14 + 1) {
    for (lVar19 = 0; lVar19 != 4; lVar19 = lVar19 + 1) {
      bVar2 = (bool)(bVar2 & *(float *)(_imath_half_to_float_table +
                                       (ulong)(*pahVar16)[lVar19]._h * 4) ==
                             *(float *)(_imath_half_to_float_table +
                                       (ulong)(*pahVar18)[lVar19]._h * 4));
    }
    pahVar18 = pahVar18 + 1;
    pahVar16 = pahVar16 + 1;
  }
  bVar20 = true;
  if (!bVar2) {
    for (uVar8 = 0; uVar8 != 0x10; uVar8 = uVar8 + 1) {
      uVar10 = A[uVar8 >> 2 & 0x3fffffff][(uint)uVar8 & 3]._h;
      if ((~uVar10 & 0x7c00) == 0) {
        auStack_58[uVar8] = 0x8000;
      }
      else {
        if ((short)uVar10 < 0) {
          uVar10 = ~uVar10;
        }
        else {
          uVar10 = uVar10 | 0x8000;
        }
        auStack_58[uVar8] = uVar10;
      }
    }
    uVar12 = 0;
    for (lVar14 = 0; lVar14 != 0x10; lVar14 = lVar14 + 1) {
      if ((ushort)uVar12 <= auStack_58[lVar14]) {
        uVar12 = (uint)auStack_58[lVar14];
      }
    }
    shift = -1;
    local_70 = B;
    do {
      shift = shift + 1;
      for (lVar14 = 0; lVar14 != 0x10; lVar14 = lVar14 + 1) {
        iVar5 = shiftAndRound(uVar12 - auStack_58[lVar14],shift);
        d[lVar14] = iVar5;
      }
      iVar13 = (d[0] - d[4]) + 0x20;
      uVar6 = d[4] - d[8];
      local_68 = (ulong)uVar6;
      aiStack_b8[1] = uVar6 + 0x20;
      uVar7 = d[8] - d[0xc];
      local_60 = (ulong)uVar7;
      aiStack_b8[2] = uVar7 + 0x20;
      aiStack_b8[3] = (d[0] - d[1]) + 0x20;
      aiStack_b8[4] = (d[4] - d[5]) + 0x20;
      aiStack_b8[5] = (d[8] - d[9]) + 0x20;
      aiStack_b8[6] = (d[0xc] - d[0xd]) + 0x20;
      aiStack_b8[7] = (d[1] - d[2]) + 0x20;
      aiStack_b8[8] = (d[5] - d[6]) + 0x20;
      aiStack_b8[9] = (d[9] - d[10]) + 0x20;
      aiStack_b8[10] = (d[0xd] - d[0xe]) + 0x20;
      aiStack_b8[0xb] = (d[2] - d[3]) + 0x20;
      aiStack_b8[0xc] = (d[6] - d[7]) + 0x20;
      aiStack_b8[0xd] = (d[10] - d[0xb]) + 0x20;
      aiStack_b8[0xe] = (d[0xe] - d[0xf]) + 0x20;
      iVar5 = iVar13;
      iVar15 = iVar13;
      for (lVar14 = 1; lVar14 != 0xf; lVar14 = lVar14 + 1) {
        iVar1 = aiStack_b8[lVar14];
        if (iVar1 <= iVar15) {
          iVar15 = iVar1;
        }
        if (iVar5 <= iVar1) {
          iVar5 = iVar1;
        }
      }
    } while ((iVar15 < 0) || (0x3f < iVar5));
    bVar9 = (byte)shift;
    A1[0] = (ushort)uVar12 - (short)(d[0] << (bVar9 & 0x1f));
    sVar4 = (short)(-0x20 << (bVar9 & 0x1f));
    sVar3 = A1[0] + sVar4;
    A1[4] = (short)(iVar13 << (bVar9 & 0x1f)) + sVar3;
    A1[1] = (short)(aiStack_b8[3] << (bVar9 & 0x1f)) + sVar3;
    A1[8] = (short)(uVar6 << (bVar9 & 0x1f)) + A1[4];
    A1[0xc] = (short)(uVar7 + uVar6 << (bVar9 & 0x1f)) + A1[4];
    A1[5] = (short)(aiStack_b8[4] << (bVar9 & 0x1f)) + sVar4 + A1[4];
    A1[9] = (short)(aiStack_b8[5] << (bVar9 & 0x1f)) + sVar4 + A1[8];
    A1[0xd] = (short)(aiStack_b8[6] << (bVar9 & 0x1f)) + sVar4 + A1[0xc];
    A1[2] = (short)(aiStack_b8[7] << (bVar9 & 0x1f)) + sVar4 + A1[1];
    A1[6] = (short)(aiStack_b8[8] << (bVar9 & 0x1f)) + sVar4 + A1[5];
    A1[10] = (short)(aiStack_b8[9] << (bVar9 & 0x1f)) + sVar4 + A1[9];
    A1[0xe] = (short)(aiStack_b8[10] << (bVar9 & 0x1f)) + sVar4 + A1[0xd];
    A1[3] = (short)(aiStack_b8[0xb] << (bVar9 & 0x1f)) + sVar4 + A1[2];
    A1[7] = (short)(aiStack_b8[0xc] << (bVar9 & 0x1f)) + sVar4 + A1[6];
    A1[0xb] = (short)(aiStack_b8[0xd] << (bVar9 & 0x1f)) + sVar4 + A1[10];
    A1[0xf] = (short)(aiStack_b8[0xe] << (bVar9 & 0x1f)) + sVar4 + A1[0xe];
    uVar8 = 0;
    while (uVar17 = uVar8, uVar17 != 0x10) {
      uVar10 = local_70[uVar17 >> 2 & 0x3fffffff][(uint)uVar17 & 3]._h;
      uVar11 = uVar10 | 0x8000;
      if ((short)uVar10 < 0) {
        uVar11 = ~uVar10;
      }
      if ((A1[uVar17] + 5 < (uint)uVar11) ||
         (uVar8 = uVar17 + 1, (int)(uint)uVar11 < (int)(A1[uVar17] - 5))) break;
    }
    bVar20 = 0xf < uVar17;
  }
  return bVar20;
}

Assistant:

bool
withinB44ErrorBounds (const half A[4][4], const half B[4][4])
{
    //
    // Assuming that a 4x4 pixel block, B, was generated by
    // compressing and uncompressing another pixel block, A,
    // using OpenEXR's B44 compression method, check whether
    // the differences between A and B are what we would
    // expect from the compressor.
    //

    //
    // The block may not have been compressed at all if it
    // was part of a very small tile.
    //

    bool equal = true;

    for (int i = 0; i < 4; ++i)
        for (int j = 0; j < 4; ++j)
            if (A[i][j] != B[i][j]) equal = false;

    if (equal) return true;

    //
    // The block was compressed.
    //
    // Perform a "light" version of the B44 compression on A
    // (see the pack() function in ImfB44Compressor.cpp).
    //

    unsigned short t[16];

    for (int i = 0; i < 16; ++i)
    {
        unsigned short Abits = A[i / 4][i % 4].bits ();

        if ((Abits & 0x7c00) == 0x7c00)
            t[i] = 0x8000;
        else if (Abits & 0x8000)
            t[i] = ~Abits;
        else
            t[i] = Abits | 0x8000;
    }

    unsigned short tMax = 0;

    for (int i = 0; i < 16; ++i)
        if (tMax < t[i]) tMax = t[i];

    int shift = -1;
    int d[16];
    int r[15];
    int rMin;
    int rMax;

    do
    {
        shift += 1;

        for (int i = 0; i < 16; ++i)
            d[i] = shiftAndRound (tMax - t[i], shift);

        const int bias = 0x20;

        r[0] = d[0] - d[4] + bias;
        r[1] = d[4] - d[8] + bias;
        r[2] = d[8] - d[12] + bias;

        r[3] = d[0] - d[1] + bias;
        r[4] = d[4] - d[5] + bias;
        r[5] = d[8] - d[9] + bias;
        r[6] = d[12] - d[13] + bias;

        r[7]  = d[1] - d[2] + bias;
        r[8]  = d[5] - d[6] + bias;
        r[9]  = d[9] - d[10] + bias;
        r[10] = d[13] - d[14] + bias;

        r[11] = d[2] - d[3] + bias;
        r[12] = d[6] - d[7] + bias;
        r[13] = d[10] - d[11] + bias;
        r[14] = d[14] - d[15] + bias;

        rMin = r[0];
        rMax = r[0];

        for (int i = 1; i < 15; ++i)
        {
            if (rMin > r[i]) rMin = r[i];

            if (rMax < r[i]) rMax = r[i];
        }
    } while (rMin < 0 || rMax > 0x3f);

    t[0] = tMax - (d[0] << shift);

    //
    // Now perform a "light" version of the decompression method.
    // (see the unpack() function in ImfB44Compressor.cpp).
    //

    unsigned short A1[16];
    const int      bias = 0x20 << shift;

    A1[0]  = t[0];
    A1[4]  = A1[0] + (r[0] << shift) - bias;
    A1[8]  = A1[4] + (r[1] << shift) - bias;
    A1[12] = A1[8] + (r[2] << shift) - bias;

    A1[1]  = A1[0] + (r[3] << shift) - bias;
    A1[5]  = A1[4] + (r[4] << shift) - bias;
    A1[9]  = A1[8] + (r[5] << shift) - bias;
    A1[13] = A1[12] + (r[6] << shift) - bias;

    A1[2]  = A1[1] + (r[7] << shift) - bias;
    A1[6]  = A1[5] + (r[8] << shift) - bias;
    A1[10] = A1[9] + (r[9] << shift) - bias;
    A1[14] = A1[13] + (r[10] << shift) - bias;

    A1[3]  = A1[2] + (r[11] << shift) - bias;
    A1[7]  = A1[6] + (r[12] << shift) - bias;
    A1[11] = A1[10] + (r[13] << shift) - bias;
    A1[15] = A1[14] + (r[14] << shift) - bias;

    //
    // Compare the result with B, allowing for an difference
    // of a couple of units in the last place.
    //

    for (int i = 0; i < 16; ++i)
    {
        unsigned short A1bits = A1[i];
        unsigned short Bbits  = B[i / 4][i % 4].bits ();

        if (Bbits & 0x8000)
            Bbits = ~Bbits;
        else
            Bbits = Bbits | 0x8000;

        if (Bbits > A1bits + 5 || Bbits < A1bits - 5) return false;
    }

    return true;
}